

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXUtil.cpp
# Opt level: O2

size_t Assimp::FBX::Util::ComputeDecodedSizeBase64(char *in,size_t inLength)

{
  size_t sVar1;
  ulong uVar2;
  ulong uVar3;
  
  if (inLength < 2) {
    return 0;
  }
  uVar2 = (ulong)(in[inLength - 2] == '=') + (ulong)(in[inLength - 1] == '=');
  uVar3 = inLength * 3 >> 2;
  sVar1 = 0;
  if (uVar2 <= uVar3) {
    sVar1 = uVar3 - uVar2;
  }
  return sVar1;
}

Assistant:

size_t ComputeDecodedSizeBase64(const char* in, size_t inLength)
{
    if (inLength < 2)
    {
        return 0;
    }
    const size_t equals = size_t(in[inLength - 1] == '=') + size_t(in[inLength - 2] == '=');
    const size_t full_length = (inLength * 3) >> 2; // div by 4
    if (full_length < equals)
    {
        return 0;
    }
    return full_length - equals;
}